

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void google::protobuf::internal::MapMergeFrom<int,proto2_unittest::ForeignMessageLite>
               (Map<int,_proto2_unittest::ForeignMessageLite> *dest,
               Map<int,_proto2_unittest::ForeignMessageLite> *src)

{
  ForeignMessageLite *this;
  ForeignMessageLite *from;
  const_iterator __begin0;
  UntypedMapIterator local_30;
  
  UntypedMapBase::begin(&local_30,(UntypedMapBase *)src);
  while (local_30.node_ != (NodeBase *)0x0) {
    from = (ForeignMessageLite *)(local_30.node_ + 2);
    this = Map<int,_proto2_unittest::ForeignMessageLite>::operator[]<int>
                     (dest,(key_arg<int> *)(local_30.node_ + 1));
    proto2_unittest::ForeignMessageLite::CopyFrom(this,from);
    UntypedMapIterator::PlusPlus(&local_30);
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void MapMergeFrom(Map<T...>& dest, const Map<T...>& src) {
  for (const auto& elem : src) {
    dest[elem.first] = elem.second;
  }
}